

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service_harbor.c
# Opt level: O2

keyvalue * hash_search(hashmap *hash,char *name)

{
  int iVar1;
  uint uVar2;
  keyvalue *pkVar3;
  
  uVar2 = *(uint *)(name + 0xc) ^ *(uint *)(name + 4) ^ *(uint *)(name + 8) ^ *(uint *)name;
  pkVar3 = (keyvalue *)(hash->node + (uVar2 & 0xfff));
  do {
    pkVar3 = pkVar3->next;
    if (pkVar3 == (keyvalue *)0x0) {
      return (keyvalue *)0x0;
    }
  } while ((pkVar3->hash != uVar2) || (iVar1 = strncmp(pkVar3->key,name,0x10), iVar1 != 0));
  return pkVar3;
}

Assistant:

static struct keyvalue *
hash_search(struct hashmap * hash, const char name[GLOBALNAME_LENGTH]) {
	uint32_t *ptr = (uint32_t*) name;
	uint32_t h = ptr[0] ^ ptr[1] ^ ptr[2] ^ ptr[3];
	struct keyvalue * node = hash->node[h % HASH_SIZE];
	while (node) {
		if (node->hash == h && strncmp(node->key, name, GLOBALNAME_LENGTH) == 0) {
			return node;
		}
		node = node->next;
	}
	return NULL;
}